

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O1

char * monster_test_global_json_parser_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_type,uint64_t *value,
                 int *aggregate)

{
  ulong *puVar1;
  byte *pbVar2;
  char *mark;
  ulong uVar3;
  uint64_t uVar4;
  char *pcVar5;
  ulong uVar6;
  ushort uVar7;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  char *mark_5;
  char *pcVar21;
  ulong *puVar22;
  byte *pbVar23;
  char *buf_00;
  
  if ((ulong)((long)end - (long)buf) < 8) {
    uVar3 = 0;
    switch((long)end - (long)buf) {
    case 7:
      uVar3 = (long)buf[6] << 8;
    case 6:
      uVar3 = uVar3 | (long)buf[5] << 0x10;
    case 5:
      uVar3 = uVar3 | (long)buf[4] << 0x18;
    case 4:
      uVar3 = uVar3 | (long)buf[3] << 0x20;
    case 3:
      uVar3 = uVar3 | (long)buf[2] << 0x28;
    case 2:
      uVar3 = uVar3 | (long)buf[1] << 0x30;
    case 1:
      uVar3 = uVar3 | (ulong)(byte)*buf << 0x38;
    }
  }
  else {
    uVar3 = *(ulong *)buf;
    uVar3 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
            (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
            (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  }
  if (uVar3 < 0x4d7947616d652e45) {
    if (uVar3 == 0x46616e746173792e) {
      puVar1 = (ulong *)(buf + 8);
      if ((ulong)((long)end - (long)puVar1) < 8) {
        uVar3 = 0;
        switch((long)end - (long)puVar1) {
        case 7:
          uVar3 = (long)buf[0xe] << 8;
        case 6:
          uVar3 = uVar3 | (long)buf[0xd] << 0x10;
        case 5:
          uVar3 = uVar3 | (long)buf[0xc] << 0x18;
        case 4:
          uVar3 = uVar3 | (long)buf[0xb] << 0x20;
        case 3:
          uVar3 = uVar3 | (long)buf[10] << 0x28;
        case 2:
          uVar3 = uVar3 | (long)buf[9] << 0x30;
        case 1:
          uVar3 = uVar3 | (ulong)(byte)*puVar1 << 0x38;
        }
      }
      else {
        uVar3 = *puVar1;
        uVar3 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 |
                uVar3 << 0x38;
      }
      if (uVar3 < 0x52656f7264657265) {
        if (uVar3 == 0x4368617261637465) {
          pbVar2 = (byte *)(buf + 0x10);
          uVar3 = (long)end - (long)pbVar2;
          if (uVar3 < 8) {
            bVar14 = 0;
            bVar15 = 0;
            bVar16 = 0;
            bVar17 = 0;
            bVar18 = 0;
            bVar19 = 0;
            bVar20 = 0;
            switch(uVar3) {
            case 7:
              bVar14 = buf[0x16] >> 7;
            case 6:
              bVar15 = bVar14 | buf[0x15] >> 7;
            case 5:
              bVar16 = bVar15 | buf[0x14] >> 7;
            case 4:
              bVar17 = bVar16 | buf[0x13] >> 7;
            case 3:
              bVar18 = bVar17 | buf[0x12] >> 7;
            case 2:
              bVar19 = bVar18 | buf[0x11] >> 7;
            case 1:
              bVar20 = bVar19 | *pbVar2;
            }
          }
          else {
            bVar20 = (byte)*(undefined8 *)pbVar2;
          }
          if (bVar20 == 0x72) {
            pbVar23 = pbVar2;
            if ((1 < (long)uVar3) && (pbVar23 = (byte *)(buf + 0x12), buf[0x11] != '.')) {
              pbVar23 = pbVar2;
            }
            if (pbVar23 != pbVar2) {
              pcVar5 = Fantasy_Character_parse_json_enum
                                 (ctx,(char *)pbVar23,end,value_type,value,aggregate);
              return pcVar5;
            }
          }
        }
      }
      else if (uVar3 == 0x52656f7264657265) {
        puVar1 = (ulong *)(buf + 0x10);
        uVar3 = (long)end - (long)puVar1;
        if (uVar3 < 8) {
          uVar6 = 0;
          switch(uVar3) {
          case 7:
            uVar6 = (long)buf[0x16] << 8;
          case 6:
            uVar6 = uVar6 | (long)buf[0x15] << 0x10;
          case 5:
            uVar6 = uVar6 | (long)buf[0x14] << 0x18;
          case 4:
            uVar6 = uVar6 | (long)buf[0x13] << 0x20;
          case 3:
            uVar6 = uVar6 | (long)buf[0x12] << 0x28;
          case 2:
            uVar6 = uVar6 | (long)buf[0x11] << 0x30;
          case 1:
            uVar6 = uVar6 | (ulong)(byte)*puVar1 << 0x38;
          }
        }
        else {
          uVar6 = *puVar1;
          uVar6 = (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                  (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28
                  | uVar6 << 0x38;
        }
        if (uVar6 >> 0x18 == 0x64456e756d) {
          puVar22 = puVar1;
          if ((5 < (long)uVar3) && (puVar22 = (ulong *)(buf + 0x16), buf[0x15] != '.')) {
            puVar22 = puVar1;
          }
          if (puVar22 != puVar1) {
            pcVar5 = Fantasy_ReorderedEnum_parse_json_enum
                               (ctx,(char *)puVar22,end,value_type,value,aggregate);
            return pcVar5;
          }
        }
        else if (uVar6 >> 0x10 == 0x64436f6c6f72) {
          puVar22 = puVar1;
          if ((6 < (long)uVar3) && (puVar22 = (ulong *)(buf + 0x17), buf[0x16] != '.')) {
            puVar22 = puVar1;
          }
          if (puVar22 != puVar1) {
            pcVar5 = Fantasy_ReorderedColor_parse_json_enum
                               (ctx,(char *)puVar22,end,value_type,value,aggregate);
            return pcVar5;
          }
        }
      }
    }
  }
  else if (uVar3 == 0x4d7947616d652e4f) {
    puVar1 = (ulong *)(buf + 8);
    if ((ulong)((long)end - (long)puVar1) < 8) {
      uVar3 = 0;
      switch((long)end - (long)puVar1) {
      case 7:
        uVar3 = (long)buf[0xe] << 8;
      case 6:
        uVar3 = uVar3 | (long)buf[0xd] << 0x10;
      case 5:
        uVar3 = uVar3 | (long)buf[0xc] << 0x18;
      case 4:
        uVar3 = uVar3 | (long)buf[0xb] << 0x20;
      case 3:
        uVar3 = uVar3 | (long)buf[10] << 0x28;
      case 2:
        uVar3 = uVar3 | (long)buf[9] << 0x30;
      case 1:
        uVar3 = uVar3 | (ulong)(byte)*puVar1 << 0x38;
      }
    }
    else {
      uVar3 = *puVar1;
      uVar3 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18
              | (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18
              | (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    }
    if (uVar3 == 0x746865724e616d65) {
      puVar1 = (ulong *)(buf + 0x10);
      if ((ulong)((long)end - (long)puVar1) < 8) {
        uVar3 = 0;
        switch((long)end - (long)puVar1) {
        case 7:
          uVar3 = (long)buf[0x16] << 8;
        case 6:
          uVar3 = uVar3 | (long)buf[0x15] << 0x10;
        case 5:
          uVar3 = uVar3 | (long)buf[0x14] << 0x18;
        case 4:
          uVar3 = uVar3 | (long)buf[0x13] << 0x20;
        case 3:
          uVar3 = uVar3 | (long)buf[0x12] << 0x28;
        case 2:
          uVar3 = uVar3 | (long)buf[0x11] << 0x30;
        case 1:
          uVar3 = uVar3 | (ulong)(byte)*puVar1 << 0x38;
        }
      }
      else {
        uVar3 = *puVar1;
        uVar3 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 |
                uVar3 << 0x38;
      }
      if (uVar3 == 0x53706163652e4672) {
        puVar1 = (ulong *)(buf + 0x18);
        if ((ulong)((long)end - (long)puVar1) < 8) {
          uVar3 = 0;
          switch((long)end - (long)puVar1) {
          case 7:
            uVar3 = (long)buf[0x1e] << 8;
          case 6:
            uVar3 = uVar3 | (long)buf[0x1d] << 0x10;
          case 5:
            uVar3 = uVar3 | (long)buf[0x1c] << 0x18;
          case 4:
            uVar3 = uVar3 | (long)buf[0x1b] << 0x20;
          case 3:
            uVar3 = uVar3 | (long)buf[0x1a] << 0x28;
          case 2:
            uVar3 = uVar3 | (long)buf[0x19] << 0x30;
          case 1:
            uVar3 = uVar3 | (ulong)(byte)*puVar1 << 0x38;
          }
        }
        else {
          uVar3 = *puVar1;
          uVar3 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                  (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                  (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28
                  | uVar3 << 0x38;
        }
        if (uVar3 == 0x6f6d496e636c7564) {
          pbVar2 = (byte *)(buf + 0x20);
          uVar3 = (long)end - (long)pbVar2;
          if (uVar3 < 8) {
            bVar14 = 0;
            bVar15 = 0;
            bVar16 = 0;
            bVar17 = 0;
            bVar18 = 0;
            bVar19 = 0;
            bVar20 = 0;
            switch(uVar3) {
            case 7:
              bVar14 = buf[0x26] >> 7;
            case 6:
              bVar15 = bVar14 | buf[0x25] >> 7;
            case 5:
              bVar16 = bVar15 | buf[0x24] >> 7;
            case 4:
              bVar17 = bVar16 | buf[0x23] >> 7;
            case 3:
              bVar18 = bVar17 | buf[0x22] >> 7;
            case 2:
              bVar19 = bVar18 | buf[0x21] >> 7;
            case 1:
              bVar20 = bVar19 | *pbVar2;
            }
          }
          else {
            bVar20 = (byte)*(undefined8 *)pbVar2;
          }
          if (bVar20 == 0x65) {
            pbVar23 = pbVar2;
            if ((1 < (long)uVar3) && (pbVar23 = (byte *)(buf + 0x22), buf[0x21] != '.')) {
              pbVar23 = pbVar2;
            }
            if (pbVar23 != pbVar2) {
              pcVar5 = MyGame_OtherNameSpace_FromInclude_parse_json_enum
                                 (ctx,(char *)pbVar23,end,value_type,value,aggregate);
              return pcVar5;
            }
          }
        }
      }
    }
  }
  else if (uVar3 == 0x4d7947616d652e45) {
    puVar1 = (ulong *)(buf + 8);
    if ((ulong)((long)end - (long)puVar1) < 8) {
      uVar3 = 0;
      switch((long)end - (long)puVar1) {
      case 7:
        uVar3 = (long)buf[0xe] << 8;
      case 6:
        uVar3 = uVar3 | (long)buf[0xd] << 0x10;
      case 5:
        uVar3 = uVar3 | (long)buf[0xc] << 0x18;
      case 4:
        uVar3 = uVar3 | (long)buf[0xb] << 0x20;
      case 3:
        uVar3 = uVar3 | (long)buf[10] << 0x28;
      case 2:
        uVar3 = uVar3 | (long)buf[9] << 0x30;
      case 1:
        uVar3 = uVar3 | (ulong)(byte)*puVar1 << 0x38;
      }
    }
    else {
      uVar3 = *puVar1;
      uVar3 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18
              | (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18
              | (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    }
    if (uVar3 < 0x78616d706c652e69) {
      if (uVar3 < 0x78616d706c652e43) {
        if (uVar3 == 0x78616d706c652e41) {
          pbVar2 = (byte *)(buf + 0x10);
          uVar3 = (long)end - (long)pbVar2;
          if (uVar3 < 8) {
            uVar8 = 0;
            uVar9 = 0;
            uVar10 = 0;
            uVar11 = 0;
            uVar12 = 0;
            uVar13 = 0;
            uVar7 = 0;
            switch(uVar3) {
            case 7:
              uVar8 = (ushort)(buf[0x16] >> 7);
            case 6:
              uVar9 = uVar8 | (ushort)(buf[0x15] >> 7);
            case 5:
              uVar10 = uVar9 | (ushort)(buf[0x14] >> 7);
            case 4:
              uVar11 = uVar10 | (ushort)(buf[0x13] >> 7);
            case 3:
              uVar12 = uVar11 | (ushort)(buf[0x12] >> 7);
            case 2:
              uVar13 = uVar12 | (short)buf[0x11];
            case 1:
              uVar7 = uVar13 | (ushort)(((ulong)*pbVar2 << 0x38) >> 0x30);
            }
          }
          else {
            uVar7 = (ushort)((ulong)*(long *)pbVar2 >> 8) & 0xff |
                    (ushort)((ulong)(*(long *)pbVar2 << 0x38) >> 0x30);
          }
          if (uVar7 == 0x6e79) {
            pbVar23 = pbVar2;
            if ((2 < (long)uVar3) && (pbVar23 = (byte *)(buf + 0x13), buf[0x12] != '.')) {
              pbVar23 = pbVar2;
            }
            if (pbVar23 != pbVar2) {
              pcVar5 = MyGame_Example_Any_parse_json_enum
                                 (ctx,(char *)pbVar23,end,value_type,value,aggregate);
              return pcVar5;
            }
          }
        }
      }
      else if (uVar3 < 0x78616d706c652e46) {
        if (uVar3 == 0x78616d706c652e43) {
          pcVar5 = buf + 0x10;
          uVar4 = flatcc_json_parser_symbol_part(pcVar5,end);
          if ((int)(uVar4 >> 0x20) == 0x6f6c6f72) {
            pcVar21 = pcVar5;
            if ((4 < (long)end - (long)pcVar5) && (pcVar21 = buf + 0x15, buf[0x14] != '.')) {
              pcVar21 = pcVar5;
            }
            if (pcVar21 != pcVar5) {
              pcVar5 = MyGame_Example_Color_parse_json_enum
                                 (ctx,pcVar21,end,value_type,value,aggregate);
              return pcVar5;
            }
          }
        }
      }
      else if (uVar3 == 0x78616d706c652e68) {
        pcVar5 = buf + 0x10;
        uVar4 = flatcc_json_parser_symbol_part(pcVar5,end);
        if (uVar4 >> 8 == 0x65785f656e756d) {
          pcVar21 = pcVar5;
          if ((7 < (long)end - (long)pcVar5) && (pcVar21 = buf + 0x18, buf[0x17] != '.')) {
            pcVar21 = pcVar5;
          }
          if (pcVar21 != pcVar5) {
            pcVar5 = MyGame_Example_hex_enum_parse_json_enum
                               (ctx,pcVar21,end,value_type,value,aggregate);
            return pcVar5;
          }
        }
      }
      else if (uVar3 == 0x78616d706c652e46) {
        pcVar5 = buf + 0x10;
        uVar4 = flatcc_json_parser_symbol_part(pcVar5,end);
        if ((short)(uVar4 >> 0x30) == 0x6f6f) {
          pcVar21 = pcVar5;
          if ((2 < (long)end - (long)pcVar5) && (pcVar21 = buf + 0x13, buf[0x12] != '.')) {
            pcVar21 = pcVar5;
          }
          if (pcVar21 != pcVar5) {
            pcVar5 = MyGame_Example_Foo_parse_json_enum(ctx,pcVar21,end,value_type,value,aggregate);
            return pcVar5;
          }
        }
      }
    }
    else if (uVar3 < 0x78616d706c652e6e) {
      if (uVar3 == 0x78616d706c652e69) {
        puVar1 = (ulong *)(buf + 0x10);
        uVar3 = (long)end - (long)puVar1;
        if (uVar3 < 8) {
          uVar6 = 0;
          switch(uVar3) {
          case 7:
            uVar6 = (long)buf[0x16] << 8;
          case 6:
            uVar6 = uVar6 | (long)buf[0x15] << 0x10;
          case 5:
            uVar6 = uVar6 | (long)buf[0x14] << 0x18;
          case 4:
            uVar6 = uVar6 | (long)buf[0x13] << 0x20;
          case 3:
            uVar6 = uVar6 | (long)buf[0x12] << 0x28;
          case 2:
            uVar6 = uVar6 | (long)buf[0x11] << 0x30;
          case 1:
            uVar6 = uVar6 | (ulong)(byte)*puVar1 << 0x38;
          }
        }
        else {
          uVar6 = *puVar1;
          uVar6 = (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
                  (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 |
                  (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
        }
        if (uVar6 == 0x6e745f656e756d00) {
          puVar22 = puVar1;
          if ((7 < (long)uVar3) && (puVar22 = (ulong *)(buf + 0x18), buf[0x17] != '.')) {
            puVar22 = puVar1;
          }
          if (puVar22 != puVar1) {
            pcVar5 = MyGame_Example_int_enum_parse_json_enum
                               (ctx,(char *)puVar22,end,value_type,value,aggregate);
            return pcVar5;
          }
        }
      }
    }
    else if (uVar3 < 0x78616d706c65322e) {
      if (uVar3 == 0x78616d706c652e6e) {
        pcVar5 = buf + 0x10;
        uVar4 = flatcc_json_parser_symbol_part(pcVar5,end);
        pcVar21 = pcVar5;
        if (uVar4 >> 8 == 0x65675f656e756d) {
          if ((7 < (long)end - (long)pcVar5) && (pcVar21 = buf + 0x18, buf[0x17] != '.')) {
            pcVar21 = pcVar5;
          }
          if (pcVar21 != pcVar5) {
            pcVar5 = MyGame_Example_neg_enum_parse_json_enum
                               (ctx,pcVar21,end,value_type,value,aggregate);
            return pcVar5;
          }
        }
        if (uVar4 == 0x6f74656d70747965) {
          pcVar5 = pcVar21 + 8;
          uVar4 = flatcc_json_parser_symbol_part(pcVar5,end);
          if ((uint)(uVar4 >> 0x28) == 0x6e756d) {
            buf_00 = pcVar5;
            if ((3 < (long)end - (long)pcVar5) && (buf_00 = pcVar21 + 0xc, pcVar21[0xb] != '.')) {
              buf_00 = pcVar5;
            }
            if (buf_00 != pcVar5) {
              pcVar5 = MyGame_Example_notemptyenum_parse_json_enum
                                 (ctx,buf_00,end,value_type,value,aggregate);
              return pcVar5;
            }
          }
        }
      }
    }
    else if (uVar3 == 0x78616d706c65322e) {
      pcVar5 = buf + 0x10;
      uVar4 = flatcc_json_parser_symbol_part(pcVar5,end);
      if (uVar4 == 0x5375625379737465) {
        uVar4 = flatcc_json_parser_symbol_part(buf + 0x18,end);
        if (uVar4 == 0x6d2e537562537973) {
          pcVar5 = buf + 0x20;
          uVar4 = flatcc_json_parser_symbol_part(pcVar5,end);
          if ((uVar4 & 0xffffffff00000000) == 0x74656d4100000000) {
            pcVar21 = pcVar5;
            if ((4 < (long)end - (long)pcVar5) && (pcVar21 = buf + 0x25, buf[0x24] != '.')) {
              pcVar21 = pcVar5;
            }
            if (pcVar21 != pcVar5) {
              pcVar5 = MyGame_Example2_SubSystem_SubSystemA_parse_json_enum
                                 (ctx,pcVar21,end,value_type,value,aggregate);
              return pcVar5;
            }
          }
          else if ((uVar4 & 0xffffffff00000000) == 0x74656d4200000000) {
            pcVar21 = pcVar5;
            if ((4 < (long)end - (long)pcVar5) && (pcVar21 = buf + 0x25, buf[0x24] != '.')) {
              pcVar21 = pcVar5;
            }
            if (pcVar21 != pcVar5) {
              pcVar5 = MyGame_Example2_SubSystem_SubSystemB_parse_json_enum
                                 (ctx,pcVar21,end,value_type,value,aggregate);
              return pcVar5;
            }
          }
        }
      }
      else if ((uint)(uVar4 >> 0x28) == 0x666f6f) {
        pcVar21 = pcVar5;
        if ((3 < (long)end - (long)pcVar5) && (pcVar21 = buf + 0x14, buf[0x13] != '.')) {
          pcVar21 = pcVar5;
        }
        if (pcVar21 != pcVar5) {
          pcVar5 = MyGame_Example2_foo_parse_json_enum(ctx,pcVar21,end,value_type,value,aggregate);
          return pcVar5;
        }
      }
    }
  }
  return buf;
}

Assistant:

static const char *monster_test_global_json_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_type, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x4d7947616d652e45) { /* branch "MyGame.E" */
        if (w == 0x46616e746173792e) { /* descend "Fantasy." */
            buf += 8;
            w = flatcc_json_parser_symbol_part(buf, end);
            if (w < 0x52656f7264657265) { /* branch "Reordere" */
                if (w == 0x4368617261637465) { /* descend "Characte" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xff00000000000000) == 0x7200000000000000) { /* "r" */
                        buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 1);
                        if (buf != mark) {
                            buf = Fantasy_Character_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                        } else {
                            return unmatched;
                        }
                    } else { /* "r" */
                        return unmatched;
                    } /* "r" */
                } else { /* descend "Characte" */
                    return unmatched;
                } /* descend "Characte" */
            } else { /* branch "Reordere" */
                if (w == 0x52656f7264657265) { /* descend "Reordere" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xffffffffff000000) == 0x64456e756d000000) { /* "dEnum" */
                        buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 5);
                        if (buf != mark) {
                            buf = Fantasy_ReorderedEnum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                        } else {
                            return unmatched;
                        }
                    } else { /* "dEnum" */
                        if ((w & 0xffffffffffff0000) == 0x64436f6c6f720000) { /* "dColor" */
                            buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 6);
                            if (buf != mark) {
                                buf = Fantasy_ReorderedColor_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                            } else {
                                return unmatched;
                            }
                        } else { /* "dColor" */
                            return unmatched;
                        } /* "dColor" */
                    } /* "dEnum" */
                } else { /* descend "Reordere" */
                    return unmatched;
                } /* descend "Reordere" */
            } /* branch "Reordere" */
        } else { /* descend "Fantasy." */
            return unmatched;
        } /* descend "Fantasy." */
    } else { /* branch "MyGame.E" */
        if (w == 0x4d7947616d652e45) { /* descend "MyGame.E" */
            buf += 8;
            w = flatcc_json_parser_symbol_part(buf, end);
            if (w < 0x78616d706c652e69) { /* branch "xample.i" */
                if (w < 0x78616d706c652e43) { /* branch "xample.C" */
                    if (w == 0x78616d706c652e41) { /* descend "xample.A" */
                        buf += 8;
                        w = flatcc_json_parser_symbol_part(buf, end);
                        if ((w & 0xffff000000000000) == 0x6e79000000000000) { /* "ny" */
                            buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 2);
                            if (buf != mark) {
                                buf = MyGame_Example_Any_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                            } else {
                                return unmatched;
                            }
                        } else { /* "ny" */
                            return unmatched;
                        } /* "ny" */
                    } else { /* descend "xample.A" */
                        return unmatched;
                    } /* descend "xample.A" */
                } else { /* branch "xample.C" */
                    if (w < 0x78616d706c652e46) { /* branch "xample.F" */
                        if (w == 0x78616d706c652e43) { /* descend "xample.C" */
                            buf += 8;
                            w = flatcc_json_parser_symbol_part(buf, end);
                            if ((w & 0xffffffff00000000) == 0x6f6c6f7200000000) { /* "olor" */
                                buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 4);
                                if (buf != mark) {
                                    buf = MyGame_Example_Color_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                                } else {
                                    return unmatched;
                                }
                            } else { /* "olor" */
                                return unmatched;
                            } /* "olor" */
                        } else { /* descend "xample.C" */
                            return unmatched;
                        } /* descend "xample.C" */
                    } else { /* branch "xample.F" */
                        if (w == 0x78616d706c652e46) { /* descend "xample.F" */
                            buf += 8;
                            w = flatcc_json_parser_symbol_part(buf, end);
                            if ((w & 0xffff000000000000) == 0x6f6f000000000000) { /* "oo" */
                                buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 2);
                                if (buf != mark) {
                                    buf = MyGame_Example_Foo_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                                } else {
                                    return unmatched;
                                }
                            } else { /* "oo" */
                                return unmatched;
                            } /* "oo" */
                        } else { /* descend "xample.F" */
                            if (w == 0x78616d706c652e68) { /* descend "xample.h" */
                                buf += 8;
                                w = flatcc_json_parser_symbol_part(buf, end);
                                if ((w & 0xffffffffffffff00) == 0x65785f656e756d00) { /* "ex_enum" */
                                    buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 7);
                                    if (buf != mark) {
                                        buf = MyGame_Example_hex_enum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                                    } else {
                                        return unmatched;
                                    }
                                } else { /* "ex_enum" */
                                    return unmatched;
                                } /* "ex_enum" */
                            } else { /* descend "xample.h" */
                                return unmatched;
                            } /* descend "xample.h" */
                        } /* descend "xample.F" */
                    } /* branch "xample.F" */
                } /* branch "xample.C" */
            } else { /* branch "xample.i" */
                if (w < 0x78616d706c652e6e) { /* branch "xample.n" */
                    if (w == 0x78616d706c652e69) { /* descend "xample.i" */
                        buf += 8;
                        w = flatcc_json_parser_symbol_part(buf, end);
                        if ((w & 0xffffffffffffff00) == 0x6e745f656e756d00) { /* "nt_enum" */
                            buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 7);
                            if (buf != mark) {
                                buf = MyGame_Example_int_enum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                            } else {
                                return unmatched;
                            }
                        } else { /* "nt_enum" */
                            return unmatched;
                        } /* "nt_enum" */
                    } else { /* descend "xample.i" */
                        return unmatched;
                    } /* descend "xample.i" */
                } else { /* branch "xample.n" */
                    if (w < 0x78616d706c65322e) { /* branch "xample2." */
                        if (w == 0x78616d706c652e6e) { /* descend "xample.n" */
                            buf += 8;
                            w = flatcc_json_parser_symbol_part(buf, end);
                            if ((w & 0xffffffffffffff00) == 0x65675f656e756d00) { /* "eg_enum" */
                                buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 7);
                                if (buf != mark) {
                                    buf = MyGame_Example_neg_enum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                                } else {
                                    goto pfguard1;
                                }
                            } else { /* "eg_enum" */
                                goto pfguard1;
                            } /* "eg_enum" */
                            goto endpfguard1;
pfguard1:
                            if (w == 0x6f74656d70747965) { /* descend "otemptye" */
                                buf += 8;
                                w = flatcc_json_parser_symbol_part(buf, end);
                                if ((w & 0xffffff0000000000) == 0x6e756d0000000000) { /* "num" */
                                    buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 3);
                                    if (buf != mark) {
                                        buf = MyGame_Example_notemptyenum_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                                    } else {
                                        return unmatched;
                                    }
                                } else { /* "num" */
                                    return unmatched;
                                } /* "num" */
                            } else { /* descend "otemptye" */
                                return unmatched;
                            } /* descend "otemptye" */
endpfguard1:
                            (void)0;
                        } else { /* descend "xample.n" */
                            return unmatched;
                        } /* descend "xample.n" */
                    } else { /* branch "xample2." */
                        if (w == 0x78616d706c65322e) { /* descend "xample2." */
                            buf += 8;
                            w = flatcc_json_parser_symbol_part(buf, end);
                            if (w == 0x5375625379737465) { /* descend "SubSyste" */
                                buf += 8;
                                w = flatcc_json_parser_symbol_part(buf, end);
                                if (w == 0x6d2e537562537973) { /* descend "m.SubSys" */
                                    buf += 8;
                                    w = flatcc_json_parser_symbol_part(buf, end);
                                    if ((w & 0xffffffff00000000) == 0x74656d4200000000) { /* "temB" */
                                        buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 4);
                                        if (buf != mark) {
                                            buf = MyGame_Example2_SubSystem_SubSystemB_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                                        } else {
                                            return unmatched;
                                        }
                                    } else { /* "temB" */
                                        if ((w & 0xffffffff00000000) == 0x74656d4100000000) { /* "temA" */
                                            buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 4);
                                            if (buf != mark) {
                                                buf = MyGame_Example2_SubSystem_SubSystemA_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                                            } else {
                                                return unmatched;
                                            }
                                        } else { /* "temA" */
                                            return unmatched;
                                        } /* "temA" */
                                    } /* "temB" */
                                } else { /* descend "m.SubSys" */
                                    return unmatched;
                                } /* descend "m.SubSys" */
                            } else { /* descend "SubSyste" */
                                if ((w & 0xffffff0000000000) == 0x666f6f0000000000) { /* "foo" */
                                    buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 3);
                                    if (buf != mark) {
                                        buf = MyGame_Example2_foo_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                                    } else {
                                        return unmatched;
                                    }
                                } else { /* "foo" */
                                    return unmatched;
                                } /* "foo" */
                            } /* descend "SubSyste" */
                        } else { /* descend "xample2." */
                            return unmatched;
                        } /* descend "xample2." */
                    } /* branch "xample2." */
                } /* branch "xample.n" */
            } /* branch "xample.i" */
        } else { /* descend "MyGame.E" */
            if (w == 0x4d7947616d652e4f) { /* descend "MyGame.O" */
                buf += 8;
                w = flatcc_json_parser_symbol_part(buf, end);
                if (w == 0x746865724e616d65) { /* descend "therName" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if (w == 0x53706163652e4672) { /* descend "Space.Fr" */
                        buf += 8;
                        w = flatcc_json_parser_symbol_part(buf, end);
                        if (w == 0x6f6d496e636c7564) { /* descend "omInclud" */
                            buf += 8;
                            w = flatcc_json_parser_symbol_part(buf, end);
                            if ((w & 0xff00000000000000) == 0x6500000000000000) { /* "e" */
                                buf = flatcc_json_parser_match_scope(ctx, (mark = buf), end, 1);
                                if (buf != mark) {
                                    buf = MyGame_OtherNameSpace_FromInclude_parse_json_enum(ctx, buf, end, value_type, value, aggregate);
                                } else {
                                    return unmatched;
                                }
                            } else { /* "e" */
                                return unmatched;
                            } /* "e" */
                        } else { /* descend "omInclud" */
                            return unmatched;
                        } /* descend "omInclud" */
                    } else { /* descend "Space.Fr" */
                        return unmatched;
                    } /* descend "Space.Fr" */
                } else { /* descend "therName" */
                    return unmatched;
                } /* descend "therName" */
            } else { /* descend "MyGame.O" */
                return unmatched;
            } /* descend "MyGame.O" */
        } /* descend "MyGame.E" */
    } /* branch "MyGame.E" */
    return buf;
}